

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86MOVSD(uchar *stream,x86XmmReg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
            int shift)

{
  byte *pbVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  
  if (size != sQWORD) {
    __assert_fail("size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x13f,
                  "int x86MOVSD(unsigned char *, x86XmmReg, x86Size, x86Reg, int, x86Reg, int)");
  }
  pbVar1 = stream + 1;
  *stream = 0xf2;
  bVar3 = 8 < (int)base | (8 < (int)index) * '\x02' | (7 < (int)dst) << 2;
  bVar4 = bVar3 != 0;
  if (bVar4) {
    *pbVar1 = bVar3 | 0x40;
  }
  (stream + (ulong)bVar4 + 1)[0] = '\x0f';
  (stream + (ulong)bVar4 + 1)[1] = '\x10';
  uVar2 = encodeAddress(pbVar1 + (ulong)bVar4 + 2,index,multiplier,base,shift,(int)(char)dst);
  return (uVar2 + (int)(pbVar1 + (ulong)bVar4 + 2)) - (int)stream;
}

Assistant:

int x86MOVSD(unsigned char *stream, x86XmmReg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sQWORD);
	(void)size;

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, dst, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x10;
	stream += encodeAddress(stream, index, multiplier, base, shift, (char)dst);

	return int(stream - start);
}